

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O2

void art_iterator_down(art_iterator_t *iterator,art_ref_t ref,uint8_t index_in_node)

{
  byte bVar1;
  uint uVar2;
  art_ref_t *paVar3;
  art_ref_t aVar4;
  char *pcVar5;
  ulong uVar6;
  
  bVar1 = iterator->frame;
  iterator->frames[bVar1].ref = ref;
  iterator->frames[bVar1].index_in_node = index_in_node;
  iterator->frame = bVar1 + 1;
  uVar2 = (uint)ref & 0xff;
  uVar6 = (ulong)(uVar2 * 8);
  pcVar5 = (char *)((ref >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar6) +
                   *(long *)((long)iterator->art->nodes + uVar6));
  switch(uVar2) {
  case 2:
    if ((byte)pcVar5[6] <= index_in_node) goto switchD_0010e95b_default;
    paVar3 = (art_ref_t *)(pcVar5 + (ulong)index_in_node * 8 + 0x10);
    break;
  case 3:
    if ((byte)pcVar5[6] <= index_in_node) goto switchD_0010e95b_default;
    paVar3 = (art_ref_t *)(pcVar5 + (ulong)index_in_node * 8 + 0x18);
    break;
  case 4:
    paVar3 = (art_ref_t *)(pcVar5 + (ulong)(byte)pcVar5[(ulong)index_in_node + 0x10] * 8 + 0x110);
    break;
  case 5:
    paVar3 = (art_ref_t *)(pcVar5 + (ulong)index_in_node * 8 + 8);
    break;
  default:
switchD_0010e95b_default:
    aVar4 = 0;
    goto LAB_0010e9a9;
  }
  aVar4 = *paVar3;
LAB_0010e9a9:
  iterator->frames[(byte)(bVar1 + 1)].ref = aVar4;
  iterator->depth = *pcVar5 + iterator->depth + '\x01';
  return;
}

Assistant:

static void art_iterator_down(art_iterator_t *iterator, art_ref_t ref,
                              uint8_t index_in_node) {
    iterator->frames[iterator->frame].ref = ref;
    iterator->frames[iterator->frame].index_in_node = index_in_node;
    iterator->frame++;
    art_inner_node_t *node = (art_inner_node_t *)art_deref(iterator->art, ref);
    art_indexed_child_t indexed_child = art_node_child_at(
        (art_node_t *)node, art_ref_typecode(ref), index_in_node);
    assert(indexed_child.child != CROARING_ART_NULL_REF);
    iterator->frames[iterator->frame].ref = indexed_child.child;
    iterator->depth += node->prefix_size + 1;
}